

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O0

void __thiscall libsbox::Pipe::Pipe(Pipe *this)

{
  int32_t __val;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Pipe *local_10;
  Pipe *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  __val = Pipe::counter;
  Pipe::counter = Pipe::counter + 1;
  std::__cxx11::to_string(&local_50,__val);
  std::operator+(&local_30,"pipe-",&local_50);
  std::__cxx11::string::operator=((string *)this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Pipe::Pipe() {
    static int32_t counter = 0;
    name_ = "pipe-" + std::to_string(counter++);
}